

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8,EVP_PKEY *pk)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  ASN1_OBJECT *aobj;
  char *__s1;
  uchar *buf;
  BIGNUM *bn;
  ASN1_STRING *a;
  uchar *puVar4;
  ASN1_STRING *str;
  ulong uVar5;
  undefined8 uVar6;
  uint len;
  uchar *priv_buf;
  
  iVar2 = EVP_PKEY_get_base_id(pk);
  aobj = OBJ_nid2obj(iVar2);
  uVar3 = pkey_bits_gost(pk);
  __s1 = get_gost_engine_param(2);
  if (7 < (int)uVar3) {
    len = uVar3 >> 3;
    buf = (uchar *)CRYPTO_secure_malloc
                             ((ulong)len,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                              ,0x2a8);
    if (buf != (uchar *)0x0) {
      bn = gost_get0_priv_key(pk);
      iVar2 = store_bignum(bn,buf,len);
      if (iVar2 == 0) {
        uVar6 = 0x2ad;
      }
      else {
        a = encode_gost_algor_params(pk);
        if (a != (ASN1_STRING *)0x0) {
          puVar4 = buf + len;
          for (uVar5 = 0; puVar4 = puVar4 + -1, uVar3 >> 4 != uVar5; uVar5 = uVar5 + 1) {
            uVar1 = buf[uVar5];
            buf[uVar5] = *puVar4;
            *puVar4 = uVar1;
          }
          if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,"LEGACY_PK_WRAP"), iVar2 == 0)) {
            str = ASN1_STRING_new();
            priv_buf = (uchar *)0x0;
            if ((str != (ASN1_STRING *)0x0) &&
               (iVar2 = ASN1_OCTET_STRING_set(str,buf,len), iVar2 != 0)) {
              iVar2 = i2d_ASN1_OCTET_STRING(str,&priv_buf);
              ASN1_STRING_free(str);
              CRYPTO_secure_free(buf,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                                 ,0x2ca);
              iVar2 = PKCS8_pkey_set0((PKCS8_PRIV_KEY_INFO *)p8,aobj,0,0x10,a,priv_buf,iVar2);
              return iVar2;
            }
            ASN1_STRING_free(str);
            ASN1_STRING_free((ASN1_STRING *)a);
            CRYPTO_secure_free(buf,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                               ,0x2c5);
            return 0;
          }
          iVar2 = PKCS8_pkey_set0((PKCS8_PRIV_KEY_INFO *)p8,aobj,0,0x10,a,buf,len);
          return iVar2;
        }
        uVar6 = 0x2b3;
      }
      CRYPTO_secure_free(buf,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,uVar6);
    }
  }
  return 0;
}

Assistant:

static int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8, const EVP_PKEY *pk)
{
    ASN1_OBJECT *algobj = OBJ_nid2obj(EVP_PKEY_base_id(pk));
    ASN1_STRING *params = NULL;
    unsigned char *buf = NULL;
    int key_len = pkey_bits_gost(pk), i = 0;
    /* unmasked private key */
    const char *pk_format = get_gost_engine_param(GOST_PARAM_PK_FORMAT);

    key_len = (key_len < 0) ? 0 : key_len / 8;
    if (key_len == 0 || !(buf = OPENSSL_secure_malloc(key_len))) {
        return 0;
    }

    if (!store_bignum(gost_get0_priv_key(pk), buf, key_len)) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    params = encode_gost_algor_params(pk);
    if (!params) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    /* Convert buf to Little-endian */
    for (i = 0; i < key_len / 2; i++) {
        unsigned char tmp = buf[i];
        buf[i] = buf[key_len - 1 - i];
        buf[key_len - 1 - i] = tmp;
    }

    if (pk_format != NULL && strcmp(pk_format, PK_WRAP_PARAM) == 0) {
        ASN1_STRING *octet = ASN1_STRING_new();
        int priv_len = 0;
        unsigned char *priv_buf = NULL;
        if (!octet || !ASN1_OCTET_STRING_set(octet, buf, key_len)) {
            ASN1_STRING_free(octet);
            ASN1_STRING_free(params);
            OPENSSL_secure_free(buf);
            return 0;
        }
        priv_len = i2d_ASN1_OCTET_STRING(octet, &priv_buf);
        ASN1_STRING_free(octet);
        OPENSSL_secure_free(buf);

        return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                               priv_buf, priv_len);
    }

    return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                           buf, key_len);
}